

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::ContentEncoding::ContentEncoding(ContentEncoding *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 5;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 1;
  in_RDI[4] = 1;
  ContentEncAESSettings::ContentEncAESSettings((ContentEncAESSettings *)(in_RDI + 5));
  in_RDI[6] = 0;
  return;
}

Assistant:

ContentEncoding::ContentEncoding()
    : enc_algo_(5),
      enc_key_id_(NULL),
      encoding_order_(0),
      encoding_scope_(1),
      encoding_type_(1),
      enc_key_id_length_(0) {}